

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  FtpServer ftpServer;
  FtpServer FStack_48;
  
  gnl::FtpServer::FtpServer(&FStack_48,0x15,(char *)0x0);
  gnl::FtpServer::start(&FStack_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_gnl::FtpConsole_&>,_std::_Select1st<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
  ::~_Rb_tree(&FStack_48.mConnection._M_t);
  return 0;
}

Assistant:

int main() {
    //signal(SIGPIPE, SIG_IGN);
    gnl::FtpServer ftpServer(21);
    ftpServer.start();


    return 0;
}